

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::FileDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,FileDescriptor *descriptor,vector<int,_std::allocator<int>_> *options_path,
          string *option_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  Tables *pTVar3;
  pointer pcVar4;
  size_t size;
  Descriptor *pDVar5;
  bool bVar6;
  char *str;
  FileOptions *this_00;
  UnknownFieldSet *pUVar7;
  char *pcVar8;
  long *plVar9;
  __node_base_ptr p_Var10;
  _Hash_node_base *p_Var11;
  pointer pUVar12;
  FieldDescriptor *pFVar13;
  __hash_code __code;
  size_type *psVar14;
  char *pcVar15;
  long lVar16;
  Descriptor *extendee;
  long lVar17;
  StringPiece SVar18;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_c0;
  Symbol local_b8 [2];
  SymbolBase local_a8 [16];
  OptionsToInterpret local_98;
  
  this_00 = (FileOptions *)
            anon_unknown_1::TableArena::AllocRawInternal(&this->tables_->arena_,0xa8,'\b');
  FileOptions::FileOptions(this_00,(Arena *)0x0,false);
  bVar6 = FileOptions::IsInitialized(orig_options);
  if (bVar6) {
    MessageLite::SerializeAsString_abi_cxx11_(&local_98.name_scope,(MessageLite *)orig_options);
    MessageLite::ParseFromString((MessageLite *)this_00,&local_98.name_scope);
    paVar1 = &local_98.name_scope.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_scope._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.name_scope._M_dataplus._M_p);
    }
    *(FileOptions **)(descriptor + 0x78) = this_00;
    if (0 < (this_00->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
      anon_unknown_1::OptionsToInterpret::OptionsToInterpret
                (&local_98,name_scope,element_name,options_path,&orig_options->super_Message,
                 (Message *)this_00);
      std::
      vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ::push_back(&this->options_to_interpret_,&local_98);
      if (local_98.element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.element_name._M_dataplus._M_p != &local_98.element_name.field_2) {
        operator_delete(local_98.element_name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name_scope._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.name_scope._M_dataplus._M_p);
      }
    }
    uVar2 = (orig_options->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar2 & 1) == 0) {
      pUVar7 = UnknownFieldSet::default_instance();
    }
    else {
      pUVar7 = (UnknownFieldSet *)((uVar2 & 0xfffffffffffffffc) + 8);
    }
    if ((pUVar7->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pUVar7->fields_).
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pTVar3 = this->tables_;
      pcVar4 = (option_name->_M_dataplus)._M_p;
      size = option_name->_M_string_length;
      if ((long)size < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size")
        ;
      }
      local_c0.ptr_ = (SymbolBase *)&local_98;
      local_98.name_scope._M_dataplus._M_p._0_1_ = 10;
      local_b8[0].ptr_ = local_c0.ptr_;
      local_98.name_scope._M_string_length = (size_type)pcVar4;
      local_98.name_scope.field_2._M_allocated_capacity = size;
      SVar18 = Symbol::full_name(local_b8);
      pcVar8 = SVar18.ptr_;
      if ((long)SVar18.length_ < 1) {
        __code = 0;
      }
      else {
        pcVar15 = pcVar8 + SVar18.length_;
        __code = 0;
        do {
          __code = (long)*pcVar8 + __code * 5;
          pcVar8 = pcVar8 + 1;
        } while (pcVar8 < pcVar15);
      }
      p_Var10 = std::
                _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::_M_find_before_node
                          (&(pTVar3->symbols_by_name_)._M_h,
                           __code % (pTVar3->symbols_by_name_)._M_h._M_bucket_count,&local_c0,__code
                          );
      if (p_Var10 == (__node_base_ptr)0x0) {
        p_Var11 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
      }
      else {
        p_Var11 = (_Hash_node_base *)&(anonymous_namespace)::kNullSymbol;
        if (p_Var10->_M_nxt != (_Hash_node_base *)0x0) {
          p_Var11 = p_Var10->_M_nxt + 1;
        }
      }
      pDVar5 = (Descriptor *)p_Var11->_M_nxt;
      if (((pDVar5 != (Descriptor *)0x0) && (pDVar5->field_0x0 == '\x01')) &&
         (pUVar12 = (pUVar7->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         0 < (int)((ulong)((long)(pUVar7->fields_).
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar12) >> 4)))
      {
        lVar17 = 0;
        lVar16 = 0;
        do {
          extendee = (Descriptor *)0x0;
          if (pDVar5->field_0x0 == '\x01') {
            extendee = pDVar5;
          }
          pFVar13 = DescriptorPool::InternalFindExtensionByNumberNoLock
                              (this->pool_,extendee,*(int *)((long)&pUVar12->number_ + lVar17));
          if (pFVar13 != (FieldDescriptor *)0x0) {
            local_98.name_scope._M_dataplus._M_p = *(pointer *)(pFVar13 + 0x10);
            pVar19 = std::
                     _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ::equal_range(&(this->unused_dependency_)._M_t,(key_type *)&local_98);
            std::
            _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ::_M_erase_aux(&(this->unused_dependency_)._M_t,(_Base_ptr)pVar19.first._M_node,
                           (_Base_ptr)pVar19.second._M_node);
          }
          lVar16 = lVar16 + 1;
          pUVar12 = (pUVar7->fields_).
                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar17 = lVar17 + 0x10;
        } while (lVar16 < (int)((ulong)((long)(pUVar7->fields_).
                                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pUVar12) >> 4));
      }
    }
  }
  else {
    pcVar4 = (name_scope->_M_dataplus)._M_p;
    local_b8[0].ptr_ = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar4,pcVar4 + name_scope->_M_string_length);
    std::__cxx11::string::append((char *)local_b8);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_b8,(ulong)(element_name->_M_dataplus)._M_p);
    paVar1 = &local_98.name_scope.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_98.name_scope.field_2._M_allocated_capacity = *psVar14;
      local_98.name_scope.field_2._8_8_ = plVar9[3];
      local_98.name_scope._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_98.name_scope.field_2._M_allocated_capacity = *psVar14;
      local_98.name_scope._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_98.name_scope._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    AddError(this,&local_98.name_scope,&orig_options->super_Message,OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_scope._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.name_scope._M_dataplus._M_p);
    }
    if (local_b8[0].ptr_ != local_a8) {
      operator_delete(local_b8[0].ptr_);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const std::string& name_scope, const std::string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, const std::vector<int>& options_path,
    const std::string& option_name) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = nullptr;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);

  if (!orig_options.IsInitialized()) {
    AddError(name_scope + "." + element_name, orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return;
  }

  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }

  // If the custom option is in unknown fields, no need to interpret it.
  // Remove the dependency file from unused_dependency.
  const UnknownFieldSet& unknown_fields = orig_options.unknown_fields();
  if (!unknown_fields.empty()) {
    // Can not use options->GetDescriptor() which may case deadlock.
    Symbol msg_symbol = tables_->FindSymbol(option_name);
    if (msg_symbol.type() == Symbol::MESSAGE) {
      for (int i = 0; i < unknown_fields.field_count(); ++i) {
        assert_mutex_held(pool_);
        const FieldDescriptor* field =
            pool_->InternalFindExtensionByNumberNoLock(
                msg_symbol.descriptor(), unknown_fields.field(i).number());
        if (field) {
          unused_dependency_.erase(field->file());
        }
      }
    }
  }
}